

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_DamageChildren
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  int flags;
  int iVar2;
  int selector;
  AActor *origin;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  VMValue *pVVar6;
  VMValue *pVVar7;
  AActor *source;
  AActor *inflictor;
  AActor *dmgtarget;
  AActor *pAVar8;
  char *pcVar9;
  bool bVar10;
  FName local_58;
  FName local_54;
  PClassActor *local_50;
  TThinkerIterator<AActor> it;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      origin = (AActor *)(param->field_0).field_1.a;
      if (origin != (AActor *)0x0) {
        if ((origin->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
          (origin->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
        }
        pPVar5 = (origin->super_DThinker).super_DObject.Class;
        bVar10 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar10) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar10 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar10) {
          pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003de1db;
        }
      }
      if (numparam == 1) {
        pcVar9 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          iVar4 = param[1].field_0.i;
          if (numparam < 3) {
            pVVar7 = defaultparam->Array;
            if (pVVar7[2].field_0.field_3.Type != '\0') {
              pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003de1fa;
            }
          }
          else {
            pVVar7 = param;
            if (param[2].field_0.field_3.Type != '\0') {
              pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_003de1fa:
              __assert_fail(pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1727,
                            "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          iVar1 = pVVar7[2].field_0.i;
          if (numparam < 4) {
            pVVar7 = defaultparam->Array;
            if (pVVar7[3].field_0.field_3.Type != '\0') {
              pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003de219;
            }
          }
          else {
            pVVar7 = param;
            if (param[3].field_0.field_3.Type != '\0') {
              pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_003de219:
              __assert_fail(pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1728,
                            "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          flags = pVVar7[3].field_0.i;
          if (numparam < 5) {
            pVVar7 = defaultparam->Array;
            if ((pVVar7[4].field_0.field_3.Type != '\x03') ||
               ((pVVar6 = pVVar7 + 4, pVVar7[4].field_0.field_1.atag != 1 &&
                ((pVVar6->field_0).field_1.a != (void *)0x0)))) {
              pcVar9 = 
              "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
              ;
              goto LAB_003de1bc;
            }
          }
          else if ((param[4].field_0.field_3.Type != '\x03') ||
                  ((pVVar6 = param + 4, param[4].field_0.field_1.atag != 1 &&
                   ((pVVar6->field_0).field_1.a != (void *)0x0)))) {
            pcVar9 = 
            "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
            ;
LAB_003de1bc:
            __assert_fail(pcVar9,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1729,
                          "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_50 = (PClassActor *)(pVVar6->field_0).field_1.a;
          if (numparam < 6) {
            pVVar7 = defaultparam->Array;
            if (pVVar7[5].field_0.field_3.Type != '\0') {
              pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003de238;
            }
          }
          else {
            pVVar7 = param;
            if (param[5].field_0.field_3.Type != '\0') {
              pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_003de238:
              __assert_fail(pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x172a,
                            "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          iVar2 = pVVar7[5].field_0.i;
          if (numparam < 7) {
            pVVar7 = defaultparam->Array;
            if (pVVar7[6].field_0.field_3.Type != '\0') {
              pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003de257;
            }
          }
          else {
            pVVar7 = param;
            if (param[6].field_0.field_3.Type != '\0') {
              pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_003de257:
              __assert_fail(pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x172b,
                            "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam < 8) {
            param = defaultparam->Array;
            if (param[7].field_0.field_3.Type == '\0') goto LAB_003de0b1;
            pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[7].field_0.field_3.Type == '\0') {
LAB_003de0b1:
              selector = param[7].field_0.i;
              source = COPY_AAPTR(origin,pVVar7[6].field_0.i);
              inflictor = COPY_AAPTR(origin,selector);
              FThinkerIterator::FThinkerIterator
                        (&it.super_FThinkerIterator,AActor::RegistrationInfo.MyClass,0x80);
              dmgtarget = (AActor *)FThinkerIterator::Next(&it.super_FThinkerIterator,false);
              if (dmgtarget != (AActor *)0x0) {
                do {
                  pAVar8 = (dmgtarget->master).field_0.p;
                  if ((pAVar8 != (AActor *)0x0) &&
                     (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                    (dmgtarget->master).field_0.p = (AActor *)0x0;
                    pAVar8 = (AActor *)0x0;
                  }
                  if (pAVar8 == origin) {
                    local_58.Index = iVar2;
                    local_54.Index = iVar1;
                    DoDamage(dmgtarget,inflictor,source,iVar4,&local_54,flags,local_50,&local_58);
                  }
                  dmgtarget = (AActor *)FThinkerIterator::Next(&it.super_FThinkerIterator,false);
                } while (dmgtarget != (AActor *)0x0);
              }
              return 0;
            }
            pcVar9 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x172c,
                        "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar9 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1726,
                    "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003de1db:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1725,
                "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DamageChildren)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(amount);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	TThinkerIterator<AActor> it;
	AActor *mo;

	while ( (mo = it.Next()) )
	{
		if (mo->master == self)
			DoDamage(mo, inflictor, source, amount, damagetype, flags, filter, species);
	}
	return 0;
}